

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall IrSim::IrSim(IrSim *this)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  
  (this->tmpVarPrefix)._M_dataplus._M_p = (pointer)&(this->tmpVarPrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"t","");
  (this->VarPrefix)._M_dataplus._M_p = (pointer)&(this->VarPrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->VarPrefix,"v","");
  (this->labelPrefix)._M_dataplus._M_p = (pointer)&(this->labelPrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->labelPrefix,"label","");
  this->PBSIZE = 0x100;
  this->tmpSeq = 1;
  this->varSeq = 1;
  this->labelSeq = 1;
  (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->argSet)._M_t._M_impl.super__Rb_tree_header;
  (this->argSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->argSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->argSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->argSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->argSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->curArray)._M_dataplus._M_p = (pointer)&(this->curArray).field_2;
  (this->curArray)._M_string_length = 0;
  (this->curArray).field_2._M_local_buf[0] = '\0';
  this->curDim = -1;
  (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->labels)._M_t._M_impl.super__Rb_tree_header;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->use).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->use).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->use).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->edges).
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->labelInBB)._M_t._M_impl.super__Rb_tree_header;
  (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->lastUsages)._M_t._M_impl.super__Rb_tree_header;
  (this->lastUsages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lastUsages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lastUsages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lastUsages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lastUsages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = (char *)operator_new__(0x100);
  this->pb = pcVar2;
  this->isOpted = false;
  return;
}

Assistant:

IrSim(): tmpSeq(1), varSeq(1), labelSeq(1), curDim(-1) { pb = new char[PBSIZE]; isOpted = false; }